

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMProcessingInstructionImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMProcessingInstructionImpl::release(DOMProcessingInstructionImpl *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMException *pDVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  MemoryManager *local_c0;
  DOMDocumentImpl *local_b0;
  long local_a0;
  MemoryManager *local_90;
  long *local_80;
  MemoryManager *local_70;
  DOMDocumentImpl *local_60;
  long local_50;
  MemoryManager *local_40;
  DOMDocumentImpl *doc;
  DOMProcessingInstructionImpl *this_local;
  
  bVar1 = DOMNodeImpl::isOwned(&this->fNode);
  if ((bVar1) && (bVar1 = DOMNodeImpl::isToBeReleased(&this->fNode), !bVar1)) {
    pDVar3 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMProcessingInstructionImpl *)0x0) {
      local_40 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*(this->super_DOMProcessingInstruction).super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar2) == 0) {
        local_50 = 0;
      }
      else {
        local_50 = CONCAT44(extraout_var,iVar2) + -8;
      }
      if (local_50 == 0) {
        local_70 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*(this->super_DOMProcessingInstruction).super_DOMNode._vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar2) == 0) {
          local_60 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_60 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar2) + -8);
        }
        local_70 = DOMDocumentImpl::getMemoryManager(local_60);
      }
      local_40 = local_70;
    }
    DOMException::DOMException(pDVar3,0xf,0,local_40);
    __cxa_throw(pDVar3,&DOMException::typeinfo,DOMException::~DOMException);
  }
  iVar2 = (*(this->super_DOMProcessingInstruction).super_DOMNode._vptr_DOMNode[0xc])();
  if (CONCAT44(extraout_var_01,iVar2) == 0) {
    local_80 = (long *)0x0;
  }
  else {
    local_80 = (long *)(CONCAT44(extraout_var_01,iVar2) + -8);
  }
  if (local_80 == (long *)0x0) {
    pDVar3 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMProcessingInstructionImpl *)0x0) {
      local_90 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*(this->super_DOMProcessingInstruction).super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_02,iVar2) == 0) {
        local_a0 = 0;
      }
      else {
        local_a0 = CONCAT44(extraout_var_02,iVar2) + -8;
      }
      if (local_a0 == 0) {
        local_c0 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*(this->super_DOMProcessingInstruction).super_DOMNode._vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_03,iVar2) == 0) {
          local_b0 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_b0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_03,iVar2) + -8);
        }
        local_c0 = DOMDocumentImpl::getMemoryManager(local_b0);
      }
      local_90 = local_c0;
    }
    DOMException::DOMException(pDVar3,0xf,0,local_90);
    __cxa_throw(pDVar3,&DOMException::typeinfo,DOMException::~DOMException);
  }
  DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_DELETED,(DOMNode *)0x0,(DOMNode *)0x0);
  DOMCharacterDataImpl::releaseBuffer(&this->fCharacterData);
  (**(code **)(*local_80 + 0x30))(local_80,this,0xb);
  return;
}

Assistant:

void DOMProcessingInstructionImpl::release()
{
    if (fNode.isOwned() && !fNode.isToBeReleased())
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);

    DOMDocumentImpl* doc = (DOMDocumentImpl*) getOwnerDocument();
    if (doc) {
        fNode.callUserDataHandlers(DOMUserDataHandler::NODE_DELETED, 0, 0);
        fCharacterData.releaseBuffer();
        doc->release(this, DOMMemoryManager::PROCESSING_INSTRUCTION_OBJECT);
    }
    else {
        // shouldn't reach here
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);
    }
}